

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

HierarchyInstantiationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::HierarchyInstantiationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::ParameterValueAssignmentSyntax*,slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,ParameterValueAssignmentSyntax **args_2,
          SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *args_3,Token *args_4)

{
  Token type;
  Token semi;
  HierarchyInstantiationSyntax *this_00;
  
  this_00 = (HierarchyInstantiationSyntax *)allocate(this,0xb0,8);
  type.kind = args_1->kind;
  type._2_1_ = args_1->field_0x2;
  type.numFlags.raw = (args_1->numFlags).raw;
  type.rawLen = args_1->rawLen;
  type.info = args_1->info;
  semi.kind = args_4->kind;
  semi._2_1_ = args_4->field_0x2;
  semi.numFlags.raw = (args_4->numFlags).raw;
  semi.rawLen = args_4->rawLen;
  semi.info = args_4->info;
  slang::syntax::HierarchyInstantiationSyntax::HierarchyInstantiationSyntax
            (this_00,args,type,*args_2,args_3,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }